

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVk.h
# Opt level: O0

void __thiscall Diligent::IDeviceContextVk::IDeviceContextVk(IDeviceContextVk *this)

{
  IDeviceContextVk *this_local;
  
  IDeviceContext::IDeviceContext(&this->super_IDeviceContext);
  (this->super_IDeviceContext).super_IObject._vptr_IObject =
       (_func_int **)&PTR___cxa_pure_virtual_010cf7f8;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IDeviceContextVk, IDeviceContext)
{
    /// Transitions the internal Vulkan image to the specified layout

    /// \param [in] pTexture  - texture to transition
    /// \param [in] NewLayout - Vulkan image layout this texture to transition to
    /// \remarks The texture state must be known to the engine.
    VIRTUAL void METHOD(TransitionImageLayout)(THIS_
                                               ITexture*     pTexture,
                                               VkImageLayout NewLayout) PURE;

    /// Transitions the internal Vulkan buffer object to the specified state

    /// \param [in] pBuffer        - Buffer to transition
    /// \param [in] NewAccessFlags - Access flags to set for the buffer
    /// \remarks The buffer state must be known to the engine.
    VIRTUAL void METHOD(BufferMemoryBarrier)(THIS_
                                             IBuffer*      pBuffer,
                                             VkAccessFlags NewAccessFlags) PURE;

    /// Returns the Vulkan handle of the command buffer currently being recorded

    /// \return - handle to the current command buffer
    ///
    /// Any command on the device context may potentially submit the command buffer for
    /// execution into the command queue and make it invalid. An application should
    /// never cache the handle and should instead request the command buffer every time it
    /// needs it.
    ///
    /// Diligent Engine internally keeps track of all resource state changes (vertex and index
    /// buffers, pipeline states, render targets, etc.). If an application changes any of these
    /// states in the command buffer, it must invalidate the engine's internal state tracking by
    /// calling IDeviceContext::InvalidateState() and then manually restore all required states via
    /// appropriate Diligent API calls.
    VIRTUAL VkCommandBuffer METHOD(GetVkCommandBuffer)(THIS) PURE;
}